

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O2

void __thiscall GlobalMemoryAccountant::restoreMemoryAllocators(GlobalMemoryAccountant *this)

{
  AccountingTestMemoryAllocator *pAVar1;
  
  pAVar1 = (AccountingTestMemoryAllocator *)getCurrentMallocAllocator();
  if (pAVar1 == this->mallocAllocator_) {
    currentMallocAllocator = this->mallocAllocator_->originalAllocator_;
  }
  pAVar1 = (AccountingTestMemoryAllocator *)getCurrentNewAllocator();
  if (pAVar1 == this->newAllocator_) {
    currentNewAllocator = this->newAllocator_->originalAllocator_;
  }
  pAVar1 = (AccountingTestMemoryAllocator *)getCurrentNewArrayAllocator();
  if (pAVar1 == this->newArrayAllocator_) {
    currentNewArrayAllocator = this->newArrayAllocator_->originalAllocator_;
  }
  return;
}

Assistant:

void GlobalMemoryAccountant::restoreMemoryAllocators()
{
    if (getCurrentMallocAllocator() == mallocAllocator_)
        setCurrentMallocAllocator(mallocAllocator_->originalAllocator());

    if (getCurrentNewAllocator() == newAllocator_)
        setCurrentNewAllocator(newAllocator_->originalAllocator());

    if (getCurrentNewArrayAllocator() == newArrayAllocator_)
        setCurrentNewArrayAllocator(newArrayAllocator_->originalAllocator());
}